

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O1

message_order * __thiscall
FIX::DataDictionary::MessageFieldsOrderHolder::getMessageOrder(MessageFieldsOrderHolder *this)

{
  int *piVar1;
  atomic<long> *counter;
  long lVar2;
  int *order;
  int *piVar3;
  int *piVar4;
  message_order local_40;
  
  if ((this->m_msgOrder).m_groupOrder.m_buffer == (int *)0x0) {
    piVar4 = (this->m_orderedFlds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = (this->m_orderedFlds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar2 = (long)piVar1 - (long)piVar4 >> 2;
    order = (int *)operator_new__(-(ulong)(lVar2 + 1U >> 0x3e != 0) | lVar2 * 4 + 4U);
    piVar3 = order;
    for (; piVar1 != piVar4; piVar4 = piVar4 + 1) {
      *piVar3 = *piVar4;
      piVar3 = piVar3 + 1;
    }
    *piVar3 = 0;
    message_order::message_order(&local_40,order);
    (this->m_msgOrder).m_mode = local_40.m_mode;
    (this->m_msgOrder).m_delim = local_40.m_delim;
    shared_array<int>::operator=(&(this->m_msgOrder).m_groupOrder,&local_40.m_groupOrder);
    piVar4 = local_40.m_groupOrder.m_buffer;
    (this->m_msgOrder).m_largest = local_40.m_largest;
    if ((long *)local_40.m_groupOrder.m_buffer != (long *)0x0) {
      LOCK();
      *(long *)local_40.m_groupOrder.m_buffer = *(long *)local_40.m_groupOrder.m_buffer + -1;
      UNLOCK();
      if (*(long *)local_40.m_groupOrder.m_buffer == 0) {
        local_40.m_groupOrder.m_size = 0;
        local_40.m_groupOrder.m_buffer = (int *)0x0;
        if ((long *)piVar4 != (long *)0x0) {
          operator_delete__(piVar4);
        }
      }
    }
    operator_delete__(order);
  }
  return &this->m_msgOrder;
}

Assistant:

const message_order &getMessageOrder() const {
      if (m_msgOrder) {
        return m_msgOrder;
      }

      int *tmp = new int[m_orderedFlds.size() + 1];
      int *i = tmp;

      for (OrderedFields::const_iterator iter = m_orderedFlds.begin(); iter != m_orderedFlds.end();
           *(i++) = *(iter++)) {}
      *i = 0;

      m_msgOrder = message_order(tmp);
      delete[] tmp;

      return m_msgOrder;
    }